

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_simple.cpp
# Opt level: O2

BoundStatement * __thiscall
duckdb::Binder::Bind(BoundStatement *__return_storage_ptr__,Binder *this,AlterStatement *stmt)

{
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> uVar1;
  bool bVar2;
  int iVar3;
  pointer pAVar4;
  pointer pAVar5;
  SetColumnCommentInfo *this_00;
  pointer pAVar6;
  StatementProperties *this_01;
  CatalogEntry *pCVar7;
  undefined4 extraout_var;
  BinderException *this_03;
  unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> *this_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<duckdb::LogicalType> __l_00;
  allocator local_aa;
  allocator_type local_a9;
  _Head_base<0UL,_duckdb::AlterInfo_*,_false> local_a8;
  EntryLookupInfo lookup_info;
  optional_ptr<duckdb::CatalogEntry,_true> entry;
  BoundStatement result;
  Catalog *this_02;
  
  result.names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  result.names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  result.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  result.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  result.plan.
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
       (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
        )0x0;
  result.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  result.names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::__cxx11::string::string((string *)&lookup_info,"Success",&local_aa);
  __l._M_len = 1;
  __l._M_array = (iterator)&lookup_info;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&entry,__l,&local_a9);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&result.names,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&entry);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&entry);
  ::std::__cxx11::string::~string((string *)&lookup_info);
  LogicalType::LogicalType((LogicalType *)&entry,BOOLEAN);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&entry;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&lookup_info,
             __l_00,(allocator_type *)&local_aa);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
            (&result.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &lookup_info);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&lookup_info);
  LogicalType::~LogicalType((LogicalType *)&entry);
  this_04 = &stmt->info;
  pAVar4 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                     (this_04);
  pAVar5 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                     (this_04);
  BindSchemaOrCatalog(this,&pAVar4->catalog,&pAVar5->schema);
  entry.ptr = (CatalogEntry *)0x0;
  pAVar4 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                     (this_04);
  if ((pAVar4->super_ParseInfo).field_0x9 == '\b') {
    this_00 = (SetColumnCommentInfo *)
              unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::
              operator->(this_04);
    entry = SetColumnCommentInfo::TryResolveCatalogEntry(this_00,&this->entry_retriever);
  }
  else {
    pAVar4 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                       (this_04);
    iVar3 = (*(pAVar4->super_ParseInfo)._vptr_ParseInfo[3])(pAVar4);
    pAVar4 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                       (this_04);
    EntryLookupInfo::EntryLookupInfo
              (&lookup_info,(CatalogType)iVar3,&pAVar4->name,(QueryErrorContext)0xffffffffffffffff);
    pAVar4 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                       (this_04);
    pAVar5 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                       (this_04);
    pAVar6 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                       (this_04);
    entry = CatalogEntryRetriever::GetEntry
                      (&this->entry_retriever,&pAVar4->catalog,&pAVar5->schema,&lookup_info,
                       (pAVar6->super_ParseInfo).field_0xa);
  }
  this_01 = GetStatementProperties(this);
  this_01->return_type = NOTHING;
  if (entry.ptr == (CatalogEntry *)0x0) {
    local_aa = (allocator)0x7d;
    make_uniq<duckdb::LogicalSimple,duckdb::LogicalOperatorType,duckdb::unique_ptr<duckdb::AlterInfo,std::default_delete<duckdb::AlterInfo>,true>>
              ((duckdb *)&lookup_info,(LogicalOperatorType *)&local_aa,this_04);
  }
  else {
    pCVar7 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&entry);
    iVar3 = (*pCVar7->_vptr_CatalogEntry[0xb])(pCVar7);
    this_02 = (Catalog *)CONCAT44(extraout_var,iVar3);
    bVar2 = Catalog::IsSystemCatalog(this_02);
    if (bVar2) {
      this_03 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&lookup_info,"Can not comment on System Catalog entries",&local_aa);
      BinderException::BinderException(this_03,(string *)&lookup_info);
      __cxa_throw(this_03,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pCVar7 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&entry);
    if (pCVar7->temporary == false) {
      StatementProperties::RegisterDBModify(this_01,this_02,this->context);
    }
    Catalog::GetName_abi_cxx11_(this_02);
    pAVar4 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                       (this_04);
    ::std::__cxx11::string::_M_assign((string *)&pAVar4->catalog);
    pCVar7 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&entry);
    (*pCVar7->_vptr_CatalogEntry[0xd])(pCVar7);
    pAVar4 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                       (this_04);
    ::std::__cxx11::string::_M_assign((string *)&pAVar4->schema);
    pAVar4 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                       (this_04);
    bVar2 = AlterInfo::IsAddPrimaryKey(pAVar4);
    if (bVar2) {
      pCVar7 = optional_ptr<duckdb::CatalogEntry,_true>::operator*(&entry);
      local_a8._M_head_impl =
           (this_04->super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>).
           _M_t.super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>.
           _M_t.super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>
           .super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl;
      (this_04->super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)._M_t.
      super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
      super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl = (AlterInfo *)0x0;
      BindAlterAddIndex(__return_storage_ptr__,this,&result,pCVar7,
                        (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>
                         *)&local_a8);
      if (local_a8._M_head_impl != (AlterInfo *)0x0) {
        (*((local_a8._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
      }
      local_a8._M_head_impl = (AlterInfo *)0x0;
      goto LAB_012c0680;
    }
    local_aa = (allocator)0x7d;
    make_uniq<duckdb::LogicalSimple,duckdb::LogicalOperatorType,duckdb::unique_ptr<duckdb::AlterInfo,std::default_delete<duckdb::AlterInfo>,true>>
              ((duckdb *)&lookup_info,(LogicalOperatorType *)&local_aa,this_04);
  }
  uVar1.super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
  _M_t.super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       result.plan.
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  result.plan.
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
       (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
       lookup_info._0_8_;
  lookup_info.catalog_type = INVALID;
  lookup_info._1_7_ = 0;
  if (uVar1.super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)uVar1.
                          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl + 8)
    )();
    if (lookup_info._0_8_ != 0) {
      (**(code **)(*(long *)lookup_info._0_8_ + 8))();
    }
  }
  BoundStatement::BoundStatement(__return_storage_ptr__,&result);
LAB_012c0680:
  BoundStatement::~BoundStatement(&result);
  return __return_storage_ptr__;
}

Assistant:

BoundStatement Binder::Bind(AlterStatement &stmt) {
	BoundStatement result;
	result.names = {"Success"};
	result.types = {LogicalType::BOOLEAN};
	BindSchemaOrCatalog(stmt.info->catalog, stmt.info->schema);

	optional_ptr<CatalogEntry> entry;
	if (stmt.info->type == AlterType::SET_COLUMN_COMMENT) {
		// Extra step for column comments: They can alter a table or a view, and we resolve that here.
		auto &info = stmt.info->Cast<SetColumnCommentInfo>();
		entry = info.TryResolveCatalogEntry(entry_retriever);

	} else {
		// For any other ALTER, we retrieve the catalog entry directly.
		EntryLookupInfo lookup_info(stmt.info->GetCatalogType(), stmt.info->name);
		entry = entry_retriever.GetEntry(stmt.info->catalog, stmt.info->schema, lookup_info, stmt.info->if_not_found);
	}

	auto &properties = GetStatementProperties();
	properties.return_type = StatementReturnType::NOTHING;
	if (!entry) {
		result.plan = make_uniq<LogicalSimple>(LogicalOperatorType::LOGICAL_ALTER, std::move(stmt.info));
		return result;
	}

	D_ASSERT(!entry->deleted);
	auto &catalog = entry->ParentCatalog();
	if (catalog.IsSystemCatalog()) {
		throw BinderException("Can not comment on System Catalog entries");
	}
	if (!entry->temporary) {
		// We can only alter temporary tables and views in read-only mode.
		properties.RegisterDBModify(catalog, context);
	}
	stmt.info->catalog = catalog.GetName();
	stmt.info->schema = entry->ParentSchema().name;

	if (!stmt.info->IsAddPrimaryKey()) {
		result.plan = make_uniq<LogicalSimple>(LogicalOperatorType::LOGICAL_ALTER, std::move(stmt.info));
		return result;
	}

	return BindAlterAddIndex(result, *entry, std::move(stmt.info));
}